

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O1

void __thiscall
PossibleContentsTest_TestTupleItems_Test::~PossibleContentsTest_TestTupleItems_Test
          (PossibleContentsTest_TestTupleItems_Test *this)

{
  PossibleContentsTest::~PossibleContentsTest(&this->super_PossibleContentsTest);
  operator_delete(this,0x3b0);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestTupleItems) {
  // All tuples must be exact (there is no subtyping for tuples).
  Type funcref = Type(HeapType::func, Nullable);
  auto tupleType = Type({Type::i32, funcref});
  PossibleContents tuple = PossibleContents::exactType(tupleType);

  // We can get the tuple items. The funcref is a full cone, as we did not have
  // depth info for it.
  EXPECT_EQ(tuple.getTupleItem(0), PossibleContents::fullConeType(Type::i32));
  EXPECT_EQ(tuple.getTupleItem(1), PossibleContents::fullConeType(funcref));
}